

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

void llama_sampler_grammar_free(llama_sampler *smpl)

{
  llama_sampler_grammar *this;
  
  this = (llama_sampler_grammar *)smpl->ctx;
  if (this->grammar != (llama_grammar *)0x0) {
    llama_grammar_free_impl(this->grammar);
  }
  llama_sampler_grammar::~llama_sampler_grammar(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

static void llama_sampler_grammar_free(struct llama_sampler * smpl) {
    const auto * ctx = (llama_sampler_grammar *) smpl->ctx;

    if (ctx->grammar) {
        llama_grammar_free_impl(ctx->grammar);
    }

    delete ctx;
}